

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

PaUtilZeroer * PaUtil_SelectZeroer(PaSampleFormat destinationFormat)

{
  PaUtilZeroer *pPVar1;
  ulong uVar2;
  
  uVar2 = destinationFormat & 0xffffffff7fffffff;
  pPVar1 = (PaUtilZeroer *)0x0;
  switch(uVar2) {
  case 1:
  case 2:
    return paZeroers.Zero32;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0010a554_caseD_3;
  case 4:
    return paZeroers.Zero24;
  case 8:
    return paZeroers.Zero16;
  default:
    pPVar1 = paZeroers.Zero8;
    if ((uVar2 != 0x10) && (pPVar1 = (PaUtilZeroer *)0x0, uVar2 == 0x20)) {
      return paZeroers.ZeroU8;
    }
switchD_0010a554_caseD_3:
    return pPVar1;
  }
}

Assistant:

PaUtilZeroer* PaUtil_SelectZeroer( PaSampleFormat destinationFormat )
{
    switch( destinationFormat & ~paNonInterleaved ){
    case paFloat32:
        return paZeroers.Zero32;
    case paInt32:
        return paZeroers.Zero32;
    case paInt24:
        return paZeroers.Zero24;
    case paInt16:
        return paZeroers.Zero16;
    case paInt8:
        return paZeroers.Zero8;
    case paUInt8:
        return paZeroers.ZeroU8;
    default: return 0;
    }
}